

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  int *piVar1;
  int *piVar2;
  Prog *pPVar3;
  Inst *pIVar4;
  uint uVar5;
  int iVar6;
  _Head_base<1UL,_re2::PODArray<int>::Deleter,_false> i;
  ulong local_1d0;
  LogMessage local_1b0;
  
  piVar1 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *piVar1 = id;
  local_1d0 = 1;
  do {
    local_1d0 = (ulong)((int)local_1d0 - 1);
    i._M_head_impl.len_ = (Deleter)piVar1[local_1d0];
    while (i._M_head_impl.len_ != 0) {
      if (i._M_head_impl.len_ == -1) {
        if (q->last_was_mark_ == false) {
          q->last_was_mark_ = false;
          iVar6 = q->nextmark_;
          q->nextmark_ = iVar6 + 1;
          SparseSetT<void>::InsertInternal(&q->super_SparseSet,false,iVar6);
        }
        break;
      }
      piVar2 = ((_Head_base<0UL,_int_*,_false> *)
               ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
               _M_head_impl;
      if ((((piVar2 != (int *)0x0) &&
           ((uint)i._M_head_impl.len_ <
            (uint)*(int *)&(q->super_SparseSet).dense_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                           super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>)) &&
          (uVar5 = ((_Head_base<0UL,_int_*,_false> *)
                   ((long)&(q->super_SparseSet).sparse_.ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                   _M_head_impl[(int)i._M_head_impl.len_], uVar5 < (uint)(q->super_SparseSet).size_)
          ) && ((Deleter)piVar2[(int)uVar5] == i._M_head_impl.len_)) break;
      q->last_was_mark_ = false;
      SparseSetT<void>::InsertInternal(&q->super_SparseSet,false,(int)i._M_head_impl.len_);
      pPVar3 = this->prog_;
      pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
               ((long)&(pPVar3->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
               + 8))->_M_head_impl;
      uVar5 = pIVar4[(int)i._M_head_impl.len_].out_opcode_;
      iVar6 = (int)local_1d0;
      switch(uVar5 & 7) {
      case 1:
        i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + 1);
        goto LAB_001b4963;
      case 2:
      case 5:
        uVar5 = uVar5 >> 3 & 1;
        i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + (uVar5 ^ 1));
        break;
      case 3:
      case 6:
        if ((uVar5 & 8) == 0) {
          local_1d0 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = (int)i._M_head_impl.len_ + 1;
        }
        if ((((pIVar4[(int)i._M_head_impl.len_].out_opcode_ & 7) == 6) && (0 < q->maxmark_)) &&
           ((i._M_head_impl.len_ == (Deleter)pPVar3->start_unanchored_ &&
            (i._M_head_impl.len_ != (Deleter)pPVar3->start_)))) {
          iVar6 = (int)local_1d0;
          local_1d0 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = -1;
        }
LAB_001b495b:
        i._M_head_impl.len_ = (Deleter)(pIVar4[(int)i._M_head_impl.len_].out_opcode_ >> 4);
LAB_001b4963:
        uVar5 = 0;
        break;
      case 4:
        if ((uVar5 & 8) == 0) {
          local_1d0 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = (int)i._M_head_impl.len_ + 1;
        }
        uVar5 = 1;
        if ((pIVar4[(int)i._M_head_impl.len_].field_1.out1_ & ~flag) == 0) goto LAB_001b495b;
        break;
      default:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                   ,0x36a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
        std::ostream::operator<<
                  ((ostream *)&local_1b0.str_,pIVar4[(int)i._M_head_impl.len_].out_opcode_ & 7);
        LogMessage::~LogMessage(&local_1b0);
        uVar5 = 1;
      }
      if ((char)uVar5 != '\0') break;
    }
    if ((int)local_1d0 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}